

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

_Bool sfp_is_optical(tcv_t *tcv)

{
  int iVar1;
  int conntype;
  tcv_t *tcv_local;
  
  iVar1 = tcv_get_connector(tcv);
  if (iVar1 < 0) {
    return false;
  }
  if (iVar1 == 0) {
    return false;
  }
  if (iVar1 == 1) {
LAB_00103ee7:
    tcv_local._7_1_ = true;
  }
  else {
    if (3 < iVar1 - 2U) {
      if (iVar1 - 6U < 7) goto LAB_00103ee7;
      if (2 < iVar1 - 0x20U) {
        return false;
      }
    }
    tcv_local._7_1_ = false;
  }
  return tcv_local._7_1_;
}

Assistant:

static bool sfp_is_optical(tcv_t *tcv)
{
	int conntype = tcv_get_connector(tcv);
	if (conntype < 0)
		return false;

	switch (conntype) {
		/* SFF-8072:  Note that 01h to 05h are not SFP compatibe */
		case TCV_CONN_STYLE_1_COPPER:
		case TCV_CONN_STYLE_2_COPPER:
		case TCV_CONN_BNC_TNC:
		case TCV_CONN_COAXIAL_HEADERS:
		/* SFP-Compatible Electrical connectors */
		case TCV_CONN_HSSDC_II:
		case TCV_CONN_COPPER_PIGTAIL:
		case TCV_CONN_RJ45:
			return false;
			/* SFP -compatible optical connectors */
		case TCV_CONN_SC: /* not compatible but optical */
		case TCV_CONN_FIBER_JACK:
		case TCV_CONN_OPTICAL_PIGTAIL:
		case TCV_CONN_LC:
		case TCV_CONN_MT_RJ:
		case TCV_CONN_MU:
		case TCV_CONN_SG:
		case TCV_CONN_MPO_PARALLEL_OPTIC:
			return true;
			/* Electrical TCVs are bad citizens, they usually respond "unknown",
			 * so it make sense to default to false */
		case TCV_CONN_UNKNOWN:
			default:
			return false;
	}
}